

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O1

void writebf(bool be,void *dst,int fldsiz,int pos,int siz,lword d)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  long lVar8;
  
  uVar3 = (pos & 7U) + siz + 7;
  if (7 < uVar3) {
    iVar5 = pos + siz + 7 >> 3;
    iVar1 = fldsiz - iVar5;
    if (be != 0) {
      iVar1 = iVar5;
    }
    cVar2 = (char)(pos & 7U);
    bVar4 = -(cVar2 + (char)siz) & 7;
    lVar8 = d << bVar4;
    iVar7 = 0xff << bVar4;
    iVar5 = (int)uVar3 >> 3;
    pbVar6 = (byte *)((long)dst + (long)iVar1);
    do {
      bVar4 = 0xff;
      if (iVar5 == 1) {
        bVar4 = ~(byte)(-1 << (8U - cVar2 & 0x1f));
      }
      bVar4 = bVar4 & (byte)iVar7;
      if (be == 0) {
        *pbVar6 = ((byte)lVar8 ^ *pbVar6) & bVar4 ^ *pbVar6;
        pbVar6 = pbVar6 + 1;
      }
      else {
        pbVar6[-1] = ((byte)lVar8 ^ pbVar6[-1]) & bVar4 ^ pbVar6[-1];
        pbVar6 = pbVar6 + -1;
      }
      iVar5 = iVar5 + -1;
      lVar8 = lVar8 >> 8;
      iVar7 = 0xff;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

void writebf(bool be,void *dst,int fldsiz,int pos,int siz,lword d)
/* write value to bitfield with length fldsiz, starting at bit-position pos */
{
  uint8_t *p = dst;
  uint8_t m,b;
  int n,sh;

  /* advance to start-byte (LSB) */
  if (be)
    p += (pos + siz + 7) >> 3;
  else
    p += fldsiz - ((pos + siz + 7) >> 3);

  pos &= 7;
  n = (pos + siz + 7) >> 3;  /* number of bytes to write */

  sh = (8 - ((pos + siz) & 7)) & 7;
  m = 0xff << sh;  /* initial mask for LSB */
  d <<= sh;  /* shift value to match bitfield */

  while (n--) {
    if (n == 0)
      m &= (1 << (8 - pos)) - 1;  /* apply mask for MSB */

    if (be) {
      /* write right to left, for big-endian target */
      b = *(--p) & ~m;
      *p = b | ((uint8_t)d & m);
    }
    else {
      /* write left to right, for little-endian target */
      b = *p & ~m;
      *p++ = b | ((uint8_t)d & m);
    }
    d >>= 8;
    m = 0xff;
  }
}